

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation_algorithm.cpp
# Opt level: O0

Score __thiscall
indigox::algorithm::ElectronOptimisationAlgorithm::CalculateVertexEnergy
          (ElectronOptimisationAlgorithm *this,ElnVertex *vert)

{
  MolVertPair id_00;
  MolVertPair id_01;
  type_conflict tVar1;
  bool bVar2;
  int iVar3;
  __normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
  __first;
  difference_type dVar4;
  size_t sVar5;
  pointer ppVar6;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph> *this_00;
  element_type *this_01;
  void *in_RDI;
  iterator pos_1;
  uint32_t k_1;
  ElnVertProp *tmpP_1;
  ElnNbrsIterPair nbrs_v;
  uint8_t valence_v;
  ElnVertProp *tmpP;
  ElnNbrsIterPair nbrs_u;
  uint8_t valence_u;
  ElnVertProp *v_prop;
  ElnVertProp *u_prop;
  ElnVertex v;
  ElnVertex u;
  iterator pos;
  uint16_t k;
  ElnVertProp *p;
  ElnNeighboursIter n;
  ElnNbrsIterPair nbrs;
  bool allZero;
  uint8_t valence;
  size_t idCount;
  MolVertPair id;
  ElnVertProp *prop;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *in_stack_fffffffffffffe08;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffe10;
  iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
  *in_stack_fffffffffffffe18;
  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
  *in_stack_fffffffffffffe20;
  __normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
  in_stack_fffffffffffffe28;
  __normal_iterator<std::pair<void_*,_void_*>_*,_std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>_>
  in_stack_fffffffffffffe30;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_1c0;
  uint local_1b4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_1b0;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_1a8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_1a0;
  uint local_194;
  ElnVertProp *local_190;
  byte local_151;
  ElnVertProp *local_150;
  byte local_111;
  ElnVertProp *local_110;
  ElnVertProp *local_108;
  pair<void_*,_void_*> local_100;
  ElnVertex local_f0;
  pair<void_*,_void_*> local_e8;
  ElnVertex local_d8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_d0;
  uint local_c4;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_c0;
  ushort local_b2;
  pair<void_*,_void_*> *local_b0;
  pair<void_*,_void_*> *local_a8;
  ElnVertProp *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  byte local_4a;
  byte local_49;
  pair<void_*,_void_*> *local_48;
  pair<void_*,_void_*> *local_40;
  difference_type local_38;
  void *local_30;
  void *local_28;
  ElnVertProp *local_20;
  Score local_4;
  
  std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x155231);
  local_20 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetProperties(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  local_30 = (local_20->id).first;
  local_28 = (local_20->id).second;
  local_40 = (pair<void_*,_void_*> *)
             std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::
             begin((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *
                   )in_stack_fffffffffffffe08);
  local_48 = (pair<void_*,_void_*> *)
             std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::
             end((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
                 in_stack_fffffffffffffe08);
  local_38 = std::
             count<__gnu_cxx::__normal_iterator<std::pair<void*,void*>*,std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>>,std::pair<void*,void*>>
                       (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        (pair<void_*,_void_*> *)in_stack_fffffffffffffe20);
  if (local_30 == local_28) {
    if ((((Options::AssignElectrons::ALLOW_CHARGED_CARBON & 1U) == 0) &&
        (local_20->atomic_number == '\x06')) && (local_20->formal_charge != '\0')) {
      local_4 = Options::AssignElectrons::INF;
    }
    else {
      if (Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE != 0) {
        iVar3 = (int)local_20->formal_charge;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        if ((ulong)Options::AssignElectrons::HIGHEST_MAGNITUDE_CHARGE < (ulong)(long)iVar3) {
          return Options::AssignElectrons::INF;
        }
      }
      local_49 = local_20->electron_count + local_20->pre_placed;
      local_4a = 1;
      std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1553a2);
      utils::
      Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
      GetNeighbours(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_98 = local_80;
      local_90 = local_78;
      local_88 = local_70;
      while (tVar1 = boost::iterators::operator!=
                               ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                                 *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18), tVar1) {
        __first._M_current =
             (pair<void_*,_void_*> *)
             std::
             __shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x155421);
        boost::iterators::detail::
        iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
        ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                     *)0x155433);
        local_a0 = utils::
                   Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                   ::GetProperties(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        local_a8 = (pair<void_*,_void_*> *)
                   std::
                   vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::
                   begin((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                          *)in_stack_fffffffffffffe08);
        local_b0 = (pair<void_*,_void_*> *)
                   std::
                   vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::
                   end((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>
                        *)in_stack_fffffffffffffe08);
        dVar4 = std::
                count<__gnu_cxx::__normal_iterator<std::pair<void*,void*>*,std::vector<std::pair<void*,void*>,std::allocator<std::pair<void*,void*>>>>,std::pair<void*,void*>>
                          (__first,in_stack_fffffffffffffe28,
                           (pair<void_*,_void_*> *)in_stack_fffffffffffffe20);
        if (dVar4 != 0) {
          local_4a = 0;
        }
        local_49 = local_49 + local_a0->electron_count + local_a0->pre_placed;
        boost::iterators::detail::
        iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
        ::operator++((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                      *)in_stack_fffffffffffffe10);
      }
      if ((local_38 == 0) && ((local_4a & 1) != 0)) {
        local_4 = 0;
      }
      else {
        std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x155521);
        sVar5 = utils::
                Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                ::Degree(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        if ((sVar5 < 3) || (local_49 <= local_20->target_hyper_octet)) {
          std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x155564);
          sVar5 = utils::
                  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                  ::Degree(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          if ((2 < sVar5) || (local_49 <= local_20->target_octet)) {
            iVar3 = (int)local_20->formal_charge;
            if (iVar3 < 1) {
              iVar3 = -iVar3;
            }
            local_b2 = (ushort)local_20->atomic_number + (short)(iVar3 << 8);
            if (local_20->formal_charge < '\0') {
              local_b2 = local_b2 + 0x8000;
            }
            local_c4 = (uint)local_b2;
            local_c0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::find(in_stack_fffffffffffffe08,(key_type *)0x155625);
            local_d0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::end(in_stack_fffffffffffffe08);
            bVar2 = std::__detail::operator==(&local_c0,&local_d0);
            if (!bVar2) {
              ppVar6 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                       operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                   *)0x155687);
              return ppVar6->second;
            }
            return Options::AssignElectrons::INF;
          }
        }
        local_4 = Options::AssignElectrons::INF;
      }
    }
  }
  else if (((Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES & 1U) == 0) && (local_38 == 0)) {
    local_4 = 0;
  }
  else {
    this_00 = &std::
               __shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1556cf)->super__ElnGraph;
    local_e8 = std::make_pair<void*&,void*&>
                         ((void **)in_stack_fffffffffffffe10,(void **)in_stack_fffffffffffffe08);
    id_00.second = in_RDI;
    id_00.first = in_stack_fffffffffffffe30._M_current;
    local_d8 = ElectronGraph::GetVertex((ElectronGraph *)in_stack_fffffffffffffe28._M_current,id_00)
    ;
    this_01 = std::
              __shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x155730);
    local_100 = std::make_pair<void*&,void*&>
                          ((void **)in_stack_fffffffffffffe10,(void **)in_stack_fffffffffffffe08);
    id_01.second = in_RDI;
    id_01.first = in_stack_fffffffffffffe30._M_current;
    local_f0 = ElectronGraph::GetVertex(this_01,id_01);
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x155799);
    local_108 = utils::
                Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                ::GetProperties(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1557c6);
    local_110 = utils::
                Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                ::GetProperties(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_111 = local_108->electron_count + local_108->pre_placed;
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x155814);
    utils::Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
    ::GetNeighbours(this_00,in_stack_fffffffffffffe18);
    while (tVar1 = boost::iterators::operator!=
                             ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                               *)this_00,in_stack_fffffffffffffe18), tVar1) {
      in_stack_fffffffffffffe18 =
           (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
            *)std::
              __shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x15585d);
      boost::iterators::detail::
      iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
      ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                   *)0x15586f);
      local_150 = utils::
                  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                  ::GetProperties(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_111 = local_111 + local_150->electron_count + local_150->pre_placed;
      boost::iterators::detail::
      iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                    *)in_stack_fffffffffffffe10);
    }
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1558d3);
    sVar5 = utils::
            Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
            ::Degree(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    if ((sVar5 < 3) || (local_111 <= local_108->target_hyper_octet)) {
      std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x155913);
      sVar5 = utils::
              Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
              ::Degree(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      if ((2 < sVar5) || (local_111 <= local_108->target_octet)) {
        local_151 = local_110->electron_count + local_110->pre_placed;
        std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x155989);
        utils::
        Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>::
        GetNeighbours(this_00,in_stack_fffffffffffffe18);
        while (tVar1 = boost::iterators::operator!=
                                 ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long>
                                   *)this_00,in_stack_fffffffffffffe18), tVar1) {
          in_stack_fffffffffffffe10 =
               &std::
                __shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1559c9)->super__ElnGraph;
          boost::iterators::detail::
          iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
          ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                       *)0x1559d8);
          local_190 = utils::
                      Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                      ::GetProperties(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          local_151 = local_151 + local_190->electron_count + local_190->pre_placed;
          boost::iterators::detail::
          iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
          ::operator++((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::setS,_boost::listS,_boost::undirectedS,_indigox::ElnVertProp,_indigox::utils::NoProperty,_boost::no_property,_boost::listS>,_void_*,_boost::detail::out_edge_iter<std::_Rb_tree_const_iterator<boost::detail::stored_edge_iter<void_*,_std::_List_iterator<boost::list_edge<void_*,_indigox::utils::NoProperty>_>,_indigox::utils::NoProperty>_>,_void_*,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_long>,_void_*,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_void_*,_long,_false,_false>
                        *)in_stack_fffffffffffffe10);
        }
        std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x155a2d);
        sVar5 = utils::
                Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                ::Degree(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        if ((sVar5 < 3) || (local_151 <= local_110->target_hyper_octet)) {
          std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x155a6d);
          sVar5 = utils::
                  Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                  ::Degree(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          if ((2 < sVar5) || (local_151 <= local_110->target_octet)) {
            local_194 = (uint)local_110->atomic_number * 0x100 + (uint)local_108->atomic_number;
            if ((Options::AssignElectrons::USE_CHARGED_BOND_ENERGIES & 1U) != 0) {
              if (local_108->formal_charge < '\0') {
                local_194 = local_194 + 0x20000;
              }
              else if ('\0' < local_108->formal_charge) {
                local_194 = local_194 + 0x10000;
              }
              if (local_110->formal_charge < '\0') {
                local_194 = local_194 + 0x80000;
              }
              else if ('\0' < local_110->formal_charge) {
                local_194 = local_194 + 0x40000;
              }
            }
            local_194 = ((uint)local_20->electron_count + (uint)local_20->pre_placed) * 0x100000 +
                        local_194;
            local_1a0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::find(in_stack_fffffffffffffe08,(key_type *)0x155bb1);
            local_1a8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::end(in_stack_fffffffffffffe08);
            bVar2 = std::__detail::operator!=(&local_1a0,&local_1a8);
            if (!bVar2) {
              local_1b4 = local_194 & *(uint *)((long)in_RDI + 0x60);
              local_1b0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::find(in_stack_fffffffffffffe08,(key_type *)0x155c20);
              local_1a0._M_cur = local_1b0._M_cur;
              local_1c0._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::end(in_stack_fffffffffffffe08);
              bVar2 = std::__detail::operator!=(&local_1a0,&local_1c0);
              if (!bVar2) {
                return Options::AssignElectrons::INF;
              }
              ppVar6 = std::__detail::
                       _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                       operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                   *)0x155c68);
              return ppVar6->second;
            }
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                     operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                 *)0x155bef);
            return ppVar6->second;
          }
        }
        return Options::AssignElectrons::INF;
      }
    }
    local_4 = Options::AssignElectrons::INF;
  }
  return local_4;
}

Assistant:

Score ElectronOptimisationAlgorithm::CalculateVertexEnergy(ElnVertex& vert) {
  ElnVertProp* prop = parent_->elnGraph_->GetProperties(vert);
  MolVertPair id = prop->id;
  size_t idCount = std::count(parent_->possibleLocations_.begin(),
                              parent_->possibleLocations_.end(), id);
  
  if (id.first == id.second) { // Atom energies
    if (!opt_::ALLOW_CHARGED_CARBON && prop->atomic_number == 6
        && prop->formal_charge != 0) {
      return opt_::INF;
    }
    if (opt_::HIGHEST_MAGNITUDE_CHARGE > 0
        && (size_t)abs(prop->formal_charge) > opt_::HIGHEST_MAGNITUDE_CHARGE) {
      return opt_::INF;
    }
    uint8_t valence = prop->electron_count + prop->pre_placed;
    bool allZero = true;
    ElnNbrsIterPair nbrs = parent_->elnGraph_->GetNeighbours(vert);
    for (ElnNeighboursIter n = nbrs.first; n != nbrs.second; ++n) {
      ElnVertProp* p = parent_->elnGraph_->GetProperties(*n);
      if (std::count(parent_->possibleLocations_.begin(),
                     parent_->possibleLocations_.end(), p->id) != 0) allZero = false;
      valence += p->electron_count + p->pre_placed;
    }
    
    if (idCount == 0 && allZero) return 0;
    
    if ((parent_->elnGraph_->Degree(vert) > 2
         && valence > prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(vert) <= 2
            && valence > prop->target_octet)){
      return opt_::INF;
    }
    
    
    uint16_t k = prop->atomic_number + (abs(prop->formal_charge) << 8);
    if (prop->formal_charge < 0)
      k += (1 << 15);
    auto pos = parent_->scores_.find(k);
    if (pos == parent_->scores_.end())
      return opt_::INF;
    else
      return pos->second;
    
  } else { // Bond energies
    if (!opt_::USE_CHARGED_BOND_ENERGIES && idCount == 0) return 0;
    ElnVertex u = parent_->elnGraph_->GetVertex(std::make_pair(id.first, id.first));
    ElnVertex v = parent_->elnGraph_->GetVertex(std::make_pair(id.second, id.second));
    ElnVertProp* u_prop = parent_->elnGraph_->GetProperties(u);
    ElnVertProp* v_prop = parent_->elnGraph_->GetProperties(v);
    
    // check valence state of both atoms
    uint8_t valence_u = u_prop->electron_count + u_prop->pre_placed;
    ElnNbrsIterPair nbrs_u = parent_->elnGraph_->GetNeighbours(u);
    for (; nbrs_u.first != nbrs_u.second; ++nbrs_u.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_u.first);
      valence_u += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(u) > 2
         && valence_u > u_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(u) <= 2
            && valence_u > u_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint8_t valence_v = v_prop->electron_count + v_prop->pre_placed;
    ElnNbrsIterPair nbrs_v = parent_->elnGraph_->GetNeighbours(v);
    for (; nbrs_v.first != nbrs_v.second; ++nbrs_v.first) {
      ElnVertProp* tmpP = parent_->elnGraph_->GetProperties(*nbrs_v.first);
      valence_v += tmpP->electron_count + tmpP->pre_placed;
    }
    if ((parent_->elnGraph_->Degree(v) > 2
         && valence_v > v_prop->target_hyper_octet)
        || (parent_->elnGraph_->Degree(v) <= 2
            && valence_v > v_prop->target_octet)) {
      return opt_::INF;
    }
    
    uint32_t k = 0;
    k += u_prop->atomic_number;
    k += (v_prop->atomic_number << 8);
    if (opt_::USE_CHARGED_BOND_ENERGIES){
      if (u_prop->formal_charge < 0)
        k += (2 << 16);
      else if (u_prop->formal_charge > 0)
        k += (1 << 16);
      if (v_prop->formal_charge < 0)
        k += (2 << 18);
      else if (v_prop->formal_charge > 0)
        k += (1 << 18);
    }
    k += ((prop->electron_count + prop->pre_placed) << 20);
    
    auto pos = parent_->scores_.find(k);
    
    if (pos != parent_->scores_.end())
      return pos->second;
    
    pos = parent_->scores_.find(k & eneBitmask_);
    if (pos != parent_->scores_.end())
      return pos->second;
    else
      return opt_::INF;
  }
}